

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O3

void __thiscall
QRenderRule::QRenderRule(QRenderRule *this,QList<QCss::Declaration> *declarations,QObject *object)

{
  QPalette *pQVar1;
  QFont *this_00;
  QSharedDataPointer<QStyleSheetBackgroundData> *this_01;
  QSharedDataPointer<QStyleSheetBorderData> *this_02;
  QPalettePrivate *pQVar2;
  undefined8 uVar3;
  QSizeF QVar4;
  int *piVar5;
  long lVar6;
  Origin OVar7;
  Attachment AVar8;
  Representation RVar9;
  Representation RVar10;
  Attachment AVar11;
  QVariant *pQVar12;
  qsizetype qVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  char cVar18;
  bool bVar19;
  char cVar20;
  int i;
  int iVar21;
  QStyleSheetGeometryData *ptr;
  QStyleSheetPositionData *ptr_00;
  QStyleSheetBoxData *ptr_01;
  QStyleSheetBorderData *pQVar22;
  QStyleSheetOutlineData *ptr_02;
  QStyleSheetBackgroundData *pQVar23;
  QStyleSheetPaletteData *this_03;
  QStyleSheetImageData *pQVar24;
  char *pcVar25;
  long *plVar26;
  long lVar27;
  QStyleSheetBorderImageData *pQVar28;
  QSize QVar29;
  QStyleSheetStyle *this_04;
  QArrayData *pQVar30;
  undefined8 *puVar31;
  long lVar32;
  longlong lVar33;
  QBrush *this_05;
  ulong uVar34;
  long lVar35;
  long lVar36;
  long in_FS_OFFSET;
  QByteArrayView layout;
  undefined1 auVar37 [16];
  QLatin1String QVar38;
  QLatin1String QVar39;
  QLatin1String QVar40;
  QLatin1String QVar41;
  QLatin1String QVar42;
  QStringView QVar43;
  QStringView QVar44;
  QLatin1String QVar45;
  QLatin1String QVar46;
  QStringView QVar47;
  QLatin1String QVar48;
  QStringView QVar49;
  QLatin1String QVar50;
  QLatin1String QVar51;
  QLatin1String QVar52;
  QStringView QVar53;
  QStringView QVar54;
  QLatin1String QVar55;
  QLatin1String QVar56;
  qreal emexSize;
  TileMode vertStretch;
  int adj;
  QIcon icon;
  QIcon imgIcon;
  QBrush accent;
  QBrush placeHolderTextForeground;
  QBrush alternateBackground;
  QBrush selectedBackground;
  QBrush selectedForeground;
  QBrush foreground;
  Origin clip;
  Attachment attachment;
  Repeat repeat;
  QBrush brush;
  int spacing;
  PositionMode mode;
  Origin origin;
  int bottom;
  int right;
  int top;
  int left;
  int maxh;
  int maxw;
  int minh;
  int minw;
  int h;
  int w;
  TileMode horizStretch;
  int integer;
  ValueExtractor v;
  double local_290;
  undefined1 *local_288;
  undefined4 local_27c;
  QSize local_278;
  QSize local_270;
  QSize local_268;
  QIcon local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  Origin local_228;
  Attachment local_224;
  QSize local_220;
  undefined1 local_218 [16];
  long local_208;
  undefined1 *local_200;
  int local_1f4;
  Int local_1f0;
  PositionMode local_1ec;
  QFlagsStorage<Qt::AlignmentFlag> local_1e8;
  Attachment local_1e4;
  Origin local_1e0;
  int local_1dc;
  int local_1d8;
  int local_1d4;
  int local_1d0;
  int local_1cc;
  int local_1c8;
  int local_1c4;
  int local_1c0;
  int local_1bc;
  QSharedDataPointer<QStyleSheetPositionData> local_1b8;
  QSharedDataPointer<QStyleSheetImageData> QStack_1b0;
  QArrayDataPointer<QVariant> local_198;
  QArrayDataPointer<QCss::Declaration> local_178;
  undefined1 *puStack_160;
  undefined1 *local_158;
  undefined1 *puStack_150;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  qsizetype local_118;
  anon_union_24_3_e3d07ef4_for_data local_108;
  char *local_f0;
  anon_union_24_3_e3d07ef4_for_data local_e8;
  char *local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  QSize local_b8;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  QSize local_98;
  undefined8 uStack_90;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 local_68 [16];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this->features = 0;
  this_05 = &this->defaultBackground;
  QBrush::QBrush(this_05);
  this_00 = &this->font;
  QFont::QFont(this_00);
  this->hasFont = false;
  (this->styleHints).d = (Data *)0x0;
  (this->pal).d.ptr = (QStyleSheetPaletteData *)0x0;
  (this->b).d.ptr = (QStyleSheetBoxData *)0x0;
  (this->bg).d.ptr = (QStyleSheetBackgroundData *)0x0;
  (this->bd).d.ptr = (QStyleSheetBorderData *)0x0;
  (this->ou).d.ptr = (QStyleSheetOutlineData *)0x0;
  (this->geo).d.ptr = (QStyleSheetGeometryData *)0x0;
  (this->p).d.ptr = (QStyleSheetPositionData *)0x0;
  (this->img).d.ptr = (QStyleSheetImageData *)0x0;
  (this->iconPtr).d.ptr = (QStyleSheetImageData *)0x0;
  this->clipset = 0;
  QPainterPath::QPainterPath(&this->clipPath);
  local_138._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_138._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QGuiApplication::palette();
  local_148._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_148._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_158 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_150 = &DAT_aaaaaaaaaaaaaaaa;
  local_178.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  puStack_160 = &DAT_aaaaaaaaaaaaaaaa;
  local_178.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_178.ptr = (Declaration *)&DAT_aaaaaaaaaaaaaaaa;
  QCss::ValueExtractor::ValueExtractor
            ((ValueExtractor *)&local_178,(QList_conflict *)declarations,(QPalette *)local_138);
  iVar21 = QCss::ValueExtractor::extractStyleFeatures();
  this->features = iVar21;
  local_1bc = -1;
  local_1c0 = -1;
  local_1c4 = -1;
  local_1c8 = -1;
  local_1cc = -1;
  local_1d0 = -1;
  cVar18 = QCss::ValueExtractor::extractGeometry
                     ((int *)&local_178,&local_1bc,&local_1c0,&local_1c4,&local_1c8,&local_1cc);
  if (cVar18 != '\0') {
    ptr = (QStyleSheetGeometryData *)operator_new(0x1c);
    (ptr->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i = 0;
    ptr->minWidth = local_1c4;
    ptr->minHeight = local_1c8;
    ptr->width = local_1bc;
    ptr->height = local_1c0;
    ptr->maxWidth = local_1cc;
    ptr->maxHeight = local_1d0;
    QSharedDataPointer<QStyleSheetGeometryData>::reset(&this->geo,ptr);
  }
  local_1d4 = 0;
  local_1d8 = 0;
  local_1dc = 0;
  local_1e0 = Origin_Unknown;
  local_1e4 = Attachment_Unknown;
  local_1e8.i = 0;
  local_1ec = PositionMode_Unknown;
  local_1f0 = 0;
  cVar18 = QCss::ValueExtractor::extractPosition
                     ((int *)&local_178,&local_1d4,&local_1d8,&local_1dc,&local_1e0,
                      (QFlags *)&local_1e4,&local_1e8.i,(QFlags *)&local_1ec);
  if (cVar18 != '\0') {
    ptr_00 = (QStyleSheetPositionData *)operator_new(0x24);
    (ptr_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i = 0;
    ptr_00->left = local_1d4;
    ptr_00->top = local_1d8;
    ptr_00->bottom = local_1e0;
    ptr_00->right = local_1dc;
    ptr_00->origin = local_1e4;
    (ptr_00->position).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
    super_QFlagsStorage<Qt::AlignmentFlag>.i = local_1e8.i;
    ptr_00->mode = local_1ec;
    (ptr_00->textAlignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
    super_QFlagsStorage<Qt::AlignmentFlag>.i = local_1f0;
    QSharedDataPointer<QStyleSheetPositionData>::reset(&this->p,ptr_00);
  }
  local_1f4 = -1;
  local_58 = 0;
  uStack_50 = 0;
  local_48 = 0;
  uStack_40 = 0;
  cVar18 = QCss::ValueExtractor::extractBox((int *)&local_178,(int *)&local_48,(int *)&local_58);
  if (cVar18 != '\0') {
    ptr_01 = (QStyleSheetBoxData *)operator_new(0x28);
    (ptr_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i = 0;
    ptr_01->spacing = local_1f4;
    *(undefined8 *)ptr_01->margins = local_48;
    *(undefined8 *)(ptr_01->margins + 2) = uStack_40;
    *(undefined8 *)ptr_01->paddings = local_58;
    *(undefined8 *)(ptr_01->paddings + 2) = uStack_50;
    QSharedDataPointer<QStyleSheetBoxData>::reset(&this->b,ptr_01);
  }
  this_01 = &this->bg;
  this_02 = &this->bd;
  local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  lVar32 = 0;
  do {
    QBrush::QBrush((QBrush *)((long)&local_88 + lVar32));
    lVar32 = lVar32 + 8;
  } while (lVar32 != 0x20);
  local_a8 = 0xffffffff;
  uStack_a4 = 0xffffffff;
  uStack_a0 = 0xffffffff;
  uStack_9c = 0xffffffff;
  local_b8.wd.m_i = -1;
  local_b8.ht.m_i = -1;
  uStack_b0 = 0xffffffff;
  uStack_ac = 0xffffffff;
  local_68 = (undefined1  [16])0x0;
  local_98.wd.m_i = 1;
  local_98.ht.m_i = 1;
  uStack_90 = 0x100000001;
  cVar18 = QCss::ValueExtractor::extractBorder
                     ((int *)&local_178,(QBrush *)local_68,(BorderStyle *)&local_88,&local_98);
  if (cVar18 != '\0') {
    pQVar22 = (QStyleSheetBorderData *)operator_new(0x70);
    QStyleSheetBorderData::QStyleSheetBorderData
              (pQVar22,(int *)local_68,(QBrush *)&local_88,(BorderStyle *)&local_98,&local_b8);
    QSharedDataPointer<QStyleSheetBorderData>::reset(this_02,pQVar22);
  }
  local_c8 = 0;
  uStack_c0 = 0;
  local_68 = ZEXT816(0);
  local_98.wd.m_i = 1;
  local_98.ht.m_i = 1;
  uStack_90 = 0x100000001;
  cVar18 = QCss::ValueExtractor::extractOutline
                     ((int *)&local_178,(QBrush *)local_68,(BorderStyle *)&local_88,&local_98,
                      (int *)&local_b8);
  if (cVar18 != '\0') {
    ptr_02 = (QStyleSheetOutlineData *)operator_new(0x80);
    QStyleSheetBorderData::QStyleSheetBorderData
              ((QStyleSheetBorderData *)ptr_02,(int *)local_68,(QBrush *)&local_88,
               (BorderStyle *)&local_98,&local_b8);
    *(undefined8 *)ptr_02->offsets = local_c8;
    *(undefined8 *)(ptr_02->offsets + 2) = uStack_c0;
    QSharedDataPointer<QStyleSheetOutlineData>::reset(&this->ou,ptr_02);
  }
  local_200 = &DAT_aaaaaaaaaaaaaaaa;
  QBrush::QBrush((QBrush *)&local_200);
  local_218._0_8_ = (QArrayData *)0x0;
  local_218._8_8_ = (char16_t *)0x0;
  local_208 = 0;
  local_220.ht.m_i = Repeat_XY;
  local_220.wd.m_i = 0x21;
  local_224 = Attachment_Scroll;
  local_1e4 = Attachment_Fixed;
  local_228 = Origin_Border;
  cVar18 = QCss::ValueExtractor::extractBackground
                     ((QBrush *)&local_178,(QString *)&local_200,(Repeat *)local_218,
                      (QFlags *)&local_220.ht,(Origin *)&local_220,&local_1e4,&local_224);
  if (cVar18 != '\0') {
    local_e8._16_4_ = 0xaaaaaaaa;
    local_e8._20_4_ = 0xaaaaaaaa;
    local_e8._0_4_ = 0xaaaaaaaa;
    local_e8._4_4_ = 0xaaaaaaaa;
    local_e8._8_4_ = 0xaaaaaaaa;
    local_e8._12_4_ = 0xaaaaaaaa;
    QStyleSheetStyle::loadPixmap((QStyleSheetStyle *)local_e8.data,(QString *)local_218,object);
    if ((local_208 != 0) && (cVar18 = QPixmap::isNull(), cVar18 != '\0')) {
      QRenderRule((QRenderRule *)local_218);
    }
    pQVar23 = (QStyleSheetBackgroundData *)operator_new(0x40);
    AVar11 = local_1e4;
    RVar10.m_i = local_220.ht.m_i;
    RVar9.m_i = local_220.wd.m_i;
    AVar8 = local_224;
    OVar7 = local_228;
    (pQVar23->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i = 0;
    QBrush::QBrush(&pQVar23->brush,(QBrush *)&local_200);
    QPixmap::QPixmap(&pQVar23->pixmap,(QPixmap *)local_e8.data);
    pQVar23->repeat = RVar10.m_i;
    (pQVar23->position).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
    super_QFlagsStorage<Qt::AlignmentFlag>.i = RVar9.m_i;
    pQVar23->origin = AVar11;
    pQVar23->attachment = AVar8;
    pQVar23->clip = OVar7;
    QSharedDataPointer<QStyleSheetBackgroundData>::reset(this_01,pQVar23);
    QPixmap::~QPixmap((QPixmap *)local_e8.data);
  }
  local_230 = &DAT_aaaaaaaaaaaaaaaa;
  QBrush::QBrush((QBrush *)&local_230);
  local_238 = &DAT_aaaaaaaaaaaaaaaa;
  QBrush::QBrush((QBrush *)&local_238);
  local_240 = &DAT_aaaaaaaaaaaaaaaa;
  QBrush::QBrush((QBrush *)&local_240);
  local_248 = &DAT_aaaaaaaaaaaaaaaa;
  QBrush::QBrush((QBrush *)&local_248);
  local_250 = &DAT_aaaaaaaaaaaaaaaa;
  QBrush::QBrush((QBrush *)&local_250);
  local_258 = &DAT_aaaaaaaaaaaaaaaa;
  QBrush::QBrush((QBrush *)&local_258);
  cVar18 = QCss::ValueExtractor::extractPalette
                     ((QBrush *)&local_178,(QBrush *)&local_230,(QBrush *)&local_238,
                      (QBrush *)&local_240,(QBrush *)&local_248,(QBrush *)&local_250);
  if (cVar18 != '\0') {
    this_03 = (QStyleSheetPaletteData *)operator_new(0x38);
    QStyleSheetPaletteData::QStyleSheetPaletteData
              (this_03,(QBrush *)&local_230,(QBrush *)&local_238,(QBrush *)&local_240,
               (QBrush *)&local_248,(QBrush *)&local_250,(QBrush *)&local_258);
    QSharedDataPointer<QStyleSheetPaletteData>::reset(&this->pal,this_03);
  }
  local_260.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QIcon::QIcon(&local_260);
  local_220.wd.m_i = 0x84;
  local_268.wd.m_i = -1;
  local_268.ht.m_i = -1;
  cVar18 = QCss::ValueExtractor::extractImage((QIcon *)&local_178,(QFlags *)&local_260,&local_220);
  if (cVar18 != '\0') {
    pQVar24 = (QStyleSheetImageData *)operator_new(0x20);
    RVar9.m_i = local_220.wd.m_i;
    (pQVar24->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i = 0;
    QIcon::QIcon(&pQVar24->icon,&local_260);
    (pQVar24->alignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
    super_QFlagsStorage<Qt::AlignmentFlag>.i = RVar9.m_i;
    pQVar24->size = local_268;
    QSharedDataPointer<QStyleSheetImageData>::reset(&this->img,pQVar24);
  }
  local_270 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  QIcon::QIcon((QIcon *)&local_270);
  local_278.wd.m_i = -1;
  local_278.ht.m_i = -1;
  cVar18 = QCss::ValueExtractor::extractIcon((QIcon *)&local_178,&local_270);
  if (cVar18 != '\0') {
    pQVar24 = (QStyleSheetImageData *)operator_new(0x20);
    (pQVar24->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i = 0;
    QIcon::QIcon(&pQVar24->icon,(QIcon *)&local_270);
    (pQVar24->alignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
    super_QFlagsStorage<Qt::AlignmentFlag>.i = 0x84;
    pQVar24->size = local_278;
    QSharedDataPointer<QStyleSheetImageData>::reset(&this->iconPtr,pQVar24);
  }
  local_27c = 0xffffff01;
  bVar19 = (bool)QCss::ValueExtractor::extractFont((QFont *)&local_178,(int *)this_00);
  this->hasFont = bVar19;
  if (object != (QObject *)0x0) {
    (*(code *)**(undefined8 **)object)(object);
    pcVar25 = (char *)QMetaObject::className();
    iVar21 = qstrcmp(pcVar25,"QTipLabel");
    if (iVar21 == 0) {
      QToolTip::palette();
      uVar14 = local_138._8_4_;
      local_138._8_4_ = local_e8._8_4_;
      local_e8._8_4_ = uVar14;
      pQVar2 = (QPalettePrivate *)CONCAT44(local_e8._4_4_,local_e8._0_4_);
      local_e8._0_4_ = (undefined4)local_138._0_8_;
      local_e8._4_4_ = SUB84(local_138._0_8_,4);
      local_138._0_8_ = pQVar2;
      QPalette::~QPalette((QPalette *)&local_e8);
    }
  }
  if ((declarations->d).size != 0) {
    uVar34 = 0;
    do {
      pQVar1 = (QPalette *)((declarations->d).ptr + uVar34);
      iVar21 = *(int *)(pQVar1->d + 0x20);
      if (iVar21 == 0x54) {
        pQVar23 = (this_01->d).ptr;
        if (pQVar23 != (QStyleSheetBackgroundData *)0x0) {
          if ((__int_type)
              (pQVar23->super_QSharedData).ref.super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> != 1) {
            QSharedDataPointer<QStyleSheetBackgroundData>::detach_helper(this_01);
            pQVar23 = (this_01->d).ptr;
            if (pQVar23 == (QStyleSheetBackgroundData *)0x0) goto LAB_003538d3;
          }
          if ((pQVar23->super_QSharedData).ref.super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i != 1) {
            QSharedDataPointer<QStyleSheetBackgroundData>::detach_helper(this_01);
            pQVar23 = (this_01->d).ptr;
          }
          if (*(int *)(*(long *)&pQVar23->brush + 4) != 0) goto LAB_00354353;
        }
LAB_003538d3:
        iVar21 = ::QVariant::toInt((bool *)(*(long *)(pQVar1->d + 0x30) + 8));
        if (iVar21 - 0x3bU < 0x16) {
          plVar26 = (long *)QPalette::brush((ColorGroup)local_138,Dark);
          QBrush::operator=(this_05,*(QColor *)(*plVar26 + 8));
        }
        goto LAB_00354353;
      }
      if (iVar21 == 0x43) {
        local_108._0_4_ = 0;
        local_108._4_4_ = 0;
        local_108._8_4_ = 0;
        local_108._12_4_ = 0;
        local_108._16_4_ = 0;
        local_108._20_4_ = 0;
        local_1b8.d.ptr._0_4_ = 0xaaaaaaaa;
        local_288 = (undefined1 *)CONCAT44(local_288._4_4_,0xaaaaaaaa);
        local_128._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_128._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QCss::Declaration::borderImageValue
                  ((QString *)pQVar1,(int *)local_108.data,(TileMode *)local_128,
                   (TileMode *)&local_1b8);
        uVar16 = local_e8._4_4_;
        uVar14 = local_e8._0_4_;
        local_e8._0_4_ = 0x831800;
        uVar15 = local_e8._0_4_;
        local_e8._4_4_ = 0;
        uVar17 = local_e8._4_4_;
        local_e8._0_4_ = uVar14;
        local_e8._4_4_ = uVar16;
        if ((CONCAT44(local_108._20_4_,local_108._16_4_) == 0) ||
           ((CONCAT44(local_108._20_4_,local_108._16_4_) == 4 &&
            (QVar47.m_data._4_4_ = local_108._12_4_, QVar47.m_data._0_4_ = local_108._8_4_,
            QVar38.m_data = "none", QVar38.m_size = 4, QVar47.m_size = 4,
            cVar18 = QtPrivate::equalStrings(QVar47,QVar38), cVar18 != '\0')))) {
          pQVar22 = (this_02->d).ptr;
          if (pQVar22 != (QStyleSheetBorderData *)0x0) {
            if ((__int_type)
                (pQVar22->super_QSharedData).ref.super_QAtomicInteger<int>.
                super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> != 1) {
              QSharedDataPointer<QStyleSheetBorderData>::detach_helper(this_02);
              pQVar22 = (this_02->d).ptr;
              if (pQVar22 == (QStyleSheetBorderData *)0x0) goto LAB_00353e20;
            }
            if ((pQVar22->super_QSharedData).ref.super_QAtomicInteger<int>.
                super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i != 1) {
              QSharedDataPointer<QStyleSheetBorderData>::detach_helper(this_02);
              pQVar22 = (this_02->d).ptr;
            }
            pQVar28 = (pQVar22->bi).d.ptr;
            if ((pQVar28 != (QStyleSheetBorderImageData *)0x0) &&
               (((__int_type)
                 (pQVar28->super_QSharedData).ref.super_QAtomicInteger<int>.
                 super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 1 ||
                (QSharedDataPointer<QStyleSheetBorderImageData>::detach_helper(&pQVar22->bi),
                (pQVar22->bi).d.ptr != (QStyleSheetBorderImageData *)0x0)))) {
              QPixmap::QPixmap((QPixmap *)&local_198);
              pQVar22 = (this_02->d).ptr;
              if (pQVar22 == (QStyleSheetBorderData *)0x0) {
                pQVar22 = (QStyleSheetBorderData *)0x0;
              }
              else if ((__int_type)
                       (pQVar22->super_QSharedData).ref.super_QAtomicInteger<int>.
                       super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> != 1) {
                QSharedDataPointer<QStyleSheetBorderData>::detach_helper(this_02);
                pQVar22 = (this_02->d).ptr;
              }
              pQVar28 = (pQVar22->bi).d.ptr;
              if (pQVar28 == (QStyleSheetBorderImageData *)0x0) {
                pQVar28 = (QStyleSheetBorderImageData *)0x0;
              }
              else if ((__int_type)
                       (pQVar28->super_QSharedData).ref.super_QAtomicInteger<int>.
                       super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> != 1) {
                QSharedDataPointer<QStyleSheetBorderImageData>::detach_helper(&pQVar22->bi);
                pQVar28 = (pQVar22->bi).d.ptr;
              }
              local_e8._16_4_ = 0xaaaaaaaa;
              local_e8._20_4_ = 0xaaaaaaaa;
              local_e8._0_4_ = 0xaaaaaaaa;
              local_e8._4_4_ = 0xaaaaaaaa;
              local_e8._8_4_ = 0xaaaaaaaa;
              local_e8._12_4_ = 0xaaaaaaaa;
              QPaintDevice::QPaintDevice((QPaintDevice *)local_e8.data);
              qVar13 = local_198.size;
              local_198.size = 0;
              uVar3 = *(undefined8 *)&pQVar28->field_0x28;
              *(qsizetype *)&pQVar28->field_0x28 = qVar13;
              local_e8._16_4_ = (undefined4)uVar3;
              local_e8._20_4_ = (undefined4)((ulong)uVar3 >> 0x20);
              local_e8._0_4_ = uVar15;
              local_e8._4_4_ = uVar17;
              QPixmap::~QPixmap((QPixmap *)local_e8.data);
              QPixmap::~QPixmap((QPixmap *)&local_198);
            }
          }
        }
        else {
          pQVar22 = (this_02->d).ptr;
          if (pQVar22 == (QStyleSheetBorderData *)0x0) {
            pQVar22 = (QStyleSheetBorderData *)operator_new(0x70);
            QStyleSheetBorderData::QStyleSheetBorderData(pQVar22);
            QSharedDataPointer<QStyleSheetBorderData>::reset(this_02,pQVar22);
            pQVar22 = (this_02->d).ptr;
          }
          if ((pQVar22->super_QSharedData).ref.super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i != 1) {
            QSharedDataPointer<QStyleSheetBorderData>::detach_helper(this_02);
            pQVar22 = (this_02->d).ptr;
          }
          if ((pQVar22->bi).d.ptr == (QStyleSheetBorderImageData *)0x0) {
            pQVar28 = (QStyleSheetBorderImageData *)operator_new(0x50);
            (pQVar28->super_QSharedData).ref.super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i = 0;
            QPixmap::QPixmap(&pQVar28->pixmap);
            QImage::QImage(&pQVar28->image);
            pQVar28->horizStretch = TileMode_Unknown;
            pQVar28->vertStretch = TileMode_Unknown;
            pQVar28->cuts[0] = -1;
            pQVar28->cuts[1] = -1;
            pQVar28->cuts[2] = -1;
            pQVar28->cuts[3] = -1;
            pQVar22 = (this_02->d).ptr;
            if ((__int_type)
                (pQVar22->super_QSharedData).ref.super_QAtomicInteger<int>.
                super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> != 1) {
              QSharedDataPointer<QStyleSheetBorderData>::detach_helper(this_02);
              pQVar22 = (this_02->d).ptr;
            }
            QSharedDataPointer<QStyleSheetBorderImageData>::reset(&pQVar22->bi,pQVar28);
            pQVar22 = (this_02->d).ptr;
            if (pQVar22 != (QStyleSheetBorderData *)0x0) goto LAB_00353b13;
            pQVar22 = (QStyleSheetBorderData *)0x0;
          }
          else {
LAB_00353b13:
            if ((pQVar22->super_QSharedData).ref.super_QAtomicInteger<int>.
                super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i != 1) {
              QSharedDataPointer<QStyleSheetBorderData>::detach_helper(this_02);
              pQVar22 = (this_02->d).ptr;
            }
          }
          pQVar28 = (pQVar22->bi).d.ptr;
          if (pQVar28 == (QStyleSheetBorderImageData *)0x0) {
            pQVar28 = (QStyleSheetBorderImageData *)0x0;
          }
          else if ((__int_type)
                   (pQVar28->super_QSharedData).ref.super_QAtomicInteger<int>.
                   super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> != 1) {
            QSharedDataPointer<QStyleSheetBorderImageData>::detach_helper(&pQVar22->bi);
            pQVar28 = (pQVar22->bi).d.ptr;
          }
          QStyleSheetStyle::loadPixmap((QStyleSheetStyle *)&local_198,(QString *)&local_108,object);
          local_e8._16_4_ = 0xaaaaaaaa;
          local_e8._20_4_ = 0xaaaaaaaa;
          local_e8._0_4_ = 0xaaaaaaaa;
          local_e8._4_4_ = 0xaaaaaaaa;
          local_e8._8_4_ = 0xaaaaaaaa;
          local_e8._12_4_ = 0xaaaaaaaa;
          QPaintDevice::QPaintDevice((QPaintDevice *)local_e8.data);
          qVar13 = local_198.size;
          local_198.size = 0;
          uVar3 = *(undefined8 *)&pQVar28->field_0x28;
          *(qsizetype *)&pQVar28->field_0x28 = qVar13;
          local_e8._16_4_ = (undefined4)uVar3;
          local_e8._20_4_ = (undefined4)((ulong)uVar3 >> 0x20);
          local_e8._0_4_ = uVar15;
          local_e8._4_4_ = uVar17;
          QPixmap::~QPixmap((QPixmap *)local_e8.data);
          QPixmap::~QPixmap((QPixmap *)&local_198);
          lVar32 = 0;
          do {
            pQVar28->cuts[lVar32] = *(int *)(local_128 + lVar32 * 4);
            lVar32 = lVar32 + 1;
          } while (lVar32 != 4);
          pQVar28->horizStretch = (TileMode)local_1b8.d.ptr;
          pQVar28->vertStretch = (TileMode)local_288;
        }
LAB_00353e20:
        piVar5 = (int *)CONCAT44(local_108._4_4_,local_108._0_4_);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            pQVar30 = (QArrayData *)CONCAT44(local_108._4_4_,local_108._0_4_);
            lVar33 = 2;
LAB_00353e47:
            QArrayData::deallocate(pQVar30,lVar33,0x10);
          }
        }
      }
      else {
        QVar48.m_size = pQVar1->d + 8;
        QVar48.m_data = &DAT_0000000a;
        cVar18 = QString::startsWith(QVar48,0x671180);
        if ((cVar18 == '\0') && (*(int *)(pQVar1->d + 0x20) == 0)) {
          pQVar2 = pQVar1->d;
          lVar32 = *(long *)(pQVar2 + 0x18);
          lVar36 = 0;
          do {
            pcVar25 = *(char **)((long)knownStyleHints._M_elems + lVar36);
            if (pcVar25 == (char *)0x0) {
              lVar35 = 0;
            }
            else {
              lVar27 = -1;
              do {
                lVar35 = lVar27 + 1;
                lVar6 = lVar27 + 1;
                lVar27 = lVar35;
              } while (pcVar25[lVar6] != '\0');
            }
            if ((lVar32 == lVar35) &&
               (QVar39.m_data = pcVar25, QVar39.m_size = lVar35,
               QVar49.m_data = *(storage_type_conflict **)(pQVar2 + 0x10), QVar49.m_size = lVar35,
               cVar18 = QtPrivate::equalStrings(QVar49,QVar39), cVar18 != '\0')) {
              local_e8._0_4_ = 0;
              local_e8._4_4_ = 0;
              local_e8._8_4_ = Active;
              local_e8._12_4_ = 0;
              local_e8._16_4_ = 0;
              local_e8._20_4_ = 0;
              local_d0 = (char *)0x2;
              QVar40.m_data = "alignment";
              QVar40.m_size = 9;
              QVar50.m_data = pcVar25;
              QVar50.m_size = lVar35;
              cVar18 = QtPrivate::endsWith(QVar50,QVar40,CaseSensitive);
              if (cVar18 == '\0') {
                QVar41.m_data = "color";
                QVar41.m_size = 5;
                QVar51.m_data = pcVar25;
                QVar51.m_size = lVar35;
                cVar18 = QtPrivate::endsWith(QVar51,QVar41,CaseSensitive);
                if (cVar18 == '\0') {
                  QVar42.m_data = "size";
                  QVar42.m_size = 4;
                  QVar52.m_data = pcVar25;
                  QVar52.m_size = lVar35;
                  cVar18 = QtPrivate::endsWith(QVar52,QVar42,CaseSensitive);
                  if (cVar18 == '\0') {
                    QVar45.m_data = "icon";
                    QVar45.m_size = 4;
                    QVar55.m_data = pcVar25;
                    QVar55.m_size = lVar35;
                    cVar18 = QtPrivate::endsWith(QVar55,QVar45,CaseSensitive);
                    if (cVar18 == '\0') {
                      if ((((lVar35 == 0xd) &&
                           (QVar46.m_data = "button-layout", QVar46.m_size = 0xd,
                           QVar56.m_data = pcVar25, QVar56.m_size = 0xd,
                           cVar18 = QtPrivate::equalStrings(QVar56,QVar46), cVar18 != '\0')) &&
                          (*(long *)(pQVar1->d + 0x38) != 0)) && (**(int **)(pQVar1->d + 0x30) == 4)
                         ) {
                        ::QVariant::toString();
                        QString::toLatin1_helper_inplace((QString *)local_128);
                        layout.m_data = (storage_type *)local_128._8_8_;
                        layout.m_size = local_118;
                        subControlLayout((QList<QVariant> *)&local_198,layout);
                        ::QVariant::QVariant((QVariant *)&local_108,(QList_conflict *)&local_198);
                        ::QVariant::operator=((QVariant *)&local_e8,(QVariant *)&local_108);
                        ::QVariant::~QVariant((QVariant *)&local_108);
                        QArrayDataPointer<QVariant>::~QArrayDataPointer(&local_198);
                        if ((QArrayData *)local_128._0_8_ != (QArrayData *)0x0) {
                          LOCK();
                          (((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>.
                          _M_i = (((QBasicAtomicInt *)local_128._0_8_)->_q_value).
                                 super___atomic_base<int>._M_i + -1;
                          UNLOCK();
                          if ((((QBasicAtomicInt *)local_128._0_8_)->_q_value).
                              super___atomic_base<int>._M_i == 0) {
                            QArrayData::deallocate((QArrayData *)local_128._0_8_,1,0x10);
                          }
                        }
                        if (local_1b8.d.ptr != (QStyleSheetPositionData *)0x0) {
                          LOCK();
                          *(int *)local_1b8.d.ptr = *(int *)local_1b8.d.ptr + -1;
                          UNLOCK();
                          if (*(int *)local_1b8.d.ptr == 0) {
                            QArrayData::deallocate((QArrayData *)local_1b8.d.ptr,2,0x10);
                          }
                        }
                      }
                      else {
                        local_198.d = (Data *)CONCAT44(local_198.d._4_4_,0xaaaaaaaa);
                        QCss::Declaration::intValue((int *)pQVar1,(char *)&local_198);
                        ::QVariant::QVariant((QVariant *)&local_108,(int)local_198.d);
                        ::QVariant::operator=((QVariant *)&local_e8,(QVariant *)&local_108);
                        ::QVariant::~QVariant((QVariant *)&local_108);
                      }
                    }
                    else {
                      QCss::Declaration::iconValue();
                      QIcon::operator_cast_to_QVariant((QVariant *)&local_108,(QIcon *)&local_198);
                      ::QVariant::operator=((QVariant *)&local_e8,(QVariant *)&local_108);
                      ::QVariant::~QVariant((QVariant *)&local_108);
                      QIcon::~QIcon((QIcon *)&local_198);
                    }
                  }
                  else {
                    local_198.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                    local_198.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                    local_198.ptr = (QVariant *)&DAT_aaaaaaaaaaaaaaaa;
                    ::QVariant::toString();
                    qVar13 = local_198.size;
                    pQVar12 = local_198.ptr;
                    QVar43.m_data = L"em";
                    QVar43.m_size = 2;
                    QVar53.m_data = (storage_type_conflict *)local_198.ptr;
                    QVar53.m_size = local_198.size;
                    cVar18 = QtPrivate::endsWith(QVar53,QVar43,CaseInsensitive);
                    if ((cVar18 == '\0') &&
                       (QVar44.m_data = L"ex", QVar44.m_size = 2,
                       QVar54.m_data = (storage_type_conflict *)pQVar12, QVar54.m_size = qVar13,
                       cVar20 = QtPrivate::endsWith(QVar54,QVar44,CaseInsensitive), cVar20 == '\0'))
                    {
                      QVar29 = (QSize)QCss::Declaration::sizeValue();
                      ::QVariant::QVariant((QVariant *)&local_108,QVar29);
                      ::QVariant::operator=((QVariant *)&local_e8,(QVariant *)&local_108);
                      ::QVariant::~QVariant((QVariant *)&local_108);
                    }
                    else {
                      local_1b8.d.ptr =
                           (totally_ordered_wrapper<QStyleSheetPositionData_*>)&DAT_aaaaaaaaaaaaaaaa
                      ;
                      QStack_1b0.d.ptr =
                           (totally_ordered_wrapper<QStyleSheetImageData_*>)&DAT_aaaaaaaaaaaaaaaa;
                      QFont::QFont((QFont *)&local_1b8,this_00);
                      if ((object != (QObject *)0x0) &&
                         ((this->hasFont == false &&
                          ((*(byte *)(*(long *)(object + 8) + 0x30) & 1) != 0)))) {
                        QFont::operator=((QFont *)&local_1b8,
                                         (QFont *)(*(long *)(object + 0x20) + 0x38));
                      }
                      local_288 = &DAT_aaaaaaaaaaaaaaaa;
                      QFontMetrics::QFontMetrics((QFontMetrics *)&local_288,(QFont *)&local_1b8);
                      if (cVar18 == '\0') {
                        iVar21 = QFontMetrics::xHeight();
                        pcVar25 = "ex";
                      }
                      else {
                        iVar21 = QFontMetrics::height();
                        pcVar25 = "em";
                      }
                      local_290 = 0.0;
                      cVar18 = QCss::Declaration::realValue((double *)pQVar1,(char *)&local_290);
                      if ((cVar18 == '\0') || (local_290 <= 0.0)) {
                        local_108._0_4_ = 2;
                        local_108._4_4_ = 0;
                        local_108._8_4_ = 0;
                        local_108._12_4_ = 0;
                        local_108._16_4_ = 0;
                        local_108._20_4_ = 0;
                        local_f0 = "default";
                        QString::toLocal8Bit_helper((QChar *)local_128,(longlong)local_198.ptr);
                        pQVar30 = (QArrayData *)local_128._8_8_;
                        if ((QArrayData *)local_128._8_8_ == (QArrayData *)0x0) {
                          pQVar30 = (QArrayData *)&QByteArray::_empty;
                        }
                        QMessageLogger::warning
                                  ((char *)local_108.data,"Invalid \'%s\' size for %s. Skipping.",
                                   pcVar25,pQVar30);
                        if ((QArrayData *)local_128._0_8_ != (QArrayData *)0x0) {
                          LOCK();
                          (((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>.
                          _M_i = (((QBasicAtomicInt *)local_128._0_8_)->_q_value).
                                 super___atomic_base<int>._M_i + -1;
                          UNLOCK();
                          if ((((QBasicAtomicInt *)local_128._0_8_)->_q_value).
                              super___atomic_base<int>._M_i == 0) {
                            QArrayData::deallocate((QArrayData *)local_128._0_8_,1,0x10);
                          }
                        }
                      }
                      else {
                        local_128._0_8_ = local_290 * (double)iVar21;
                        local_128._8_8_ = local_128._0_8_;
                        ::QVariant::QVariant
                                  ((QVariant *)&local_108,
                                   (QMetaTypeInterface *)
                                   &QtPrivate::QMetaTypeInterfaceWrapper<QSizeF>::metaType,local_128
                                  );
                        ::QVariant::operator=((QVariant *)(pQVar1->d + 0x40),(QVariant *)&local_108)
                        ;
                        ::QVariant::~QVariant((QVariant *)&local_108);
                        QVar4.ht = (qreal)local_128._8_8_;
                        QVar4.wd = (qreal)local_128._0_8_;
                        ::QVariant::QVariant((QVariant *)&local_108,QVar4);
                        ::QVariant::operator=((QVariant *)&local_e8,(QVariant *)&local_108);
                        ::QVariant::~QVariant((QVariant *)&local_108);
                      }
                      QFontMetrics::~QFontMetrics((QFontMetrics *)&local_288);
                      QFont::~QFont((QFont *)&local_1b8);
                    }
                    if (&(local_198.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_198.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                           = ((local_198.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_198.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                          _M_i == 0) {
                        QArrayData::deallocate(&(local_198.d)->super_QArrayData,2,0x10);
                      }
                    }
                  }
                }
                else {
                  QPalette::QPalette((QPalette *)local_128);
                  auVar37 = QCss::Declaration::colorValue(pQVar1);
                  local_198.d = auVar37._0_8_;
                  local_198.ptr._0_6_ = auVar37._8_6_;
                  iVar21 = QColor::rgba();
                  ::QVariant::QVariant((QVariant *)&local_108,iVar21);
                  ::QVariant::operator=((QVariant *)&local_e8,(QVariant *)&local_108);
                  ::QVariant::~QVariant((QVariant *)&local_108);
                  QPalette::~QPalette((QPalette *)local_128);
                }
              }
              else {
                iVar21 = QCss::Declaration::alignmentValue();
                ::QVariant::QVariant((QVariant *)&local_108,iVar21);
                ::QVariant::operator=((QVariant *)&local_e8,(QVariant *)&local_108);
                ::QVariant::~QVariant((QVariant *)&local_108);
              }
              QHash<QString,QVariant>::tryEmplace_impl<QString_const&>
                        ((TryEmplaceResult *)&local_108,&this->styleHints,(QString *)(pQVar1->d + 8)
                        );
              lVar32 = *(long *)(CONCAT44(local_108._4_4_,local_108._0_4_) + 0x20);
              lVar36 = (CONCAT44(local_108._12_4_,local_108._8_4_) >> 7) * 0x90;
              ::QVariant::operator=
                        ((QVariant *)
                         (*(long *)(lVar32 + 0x80 + lVar36) +
                          (ulong)*(byte *)((ulong)(local_108._8_4_ & 0x7f) + lVar32 + lVar36) * 0x38
                         + 0x18),(QVariant *)&local_e8);
              ::QVariant::~QVariant((QVariant *)&local_e8);
              goto LAB_00354353;
            }
            lVar36 = lVar36 + 8;
          } while (lVar36 != 0x2d0);
          local_e8._0_4_ = 2;
          local_e8._4_4_ = 0;
          local_e8._8_4_ = Active;
          local_e8._12_4_ = 0;
          local_e8._16_4_ = 0;
          local_e8._20_4_ = 0;
          local_d0 = "default";
          QString::toLocal8Bit_helper((QChar *)&local_108,*(longlong *)(pQVar1->d + 0x10));
          puVar31 = (undefined8 *)CONCAT44(local_108._12_4_,local_108._8_4_);
          if (puVar31 == (undefined8 *)0x0) {
            puVar31 = &QByteArray::_empty;
          }
          QMessageLogger::warning((char *)local_e8.data,"Unknown property %s",puVar31);
          piVar5 = (int *)CONCAT44(local_108._4_4_,local_108._0_4_);
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if (*piVar5 == 0) {
              pQVar30 = (QArrayData *)CONCAT44(local_108._4_4_,local_108._0_4_);
              lVar33 = 1;
              goto LAB_00353e47;
            }
          }
        }
      }
LAB_00354353:
      uVar34 = uVar34 + 1;
    } while (uVar34 < (ulong)(declarations->d).size);
  }
  if ((this_02->d).ptr == (QStyleSheetBorderData *)0x0) goto LAB_003544a3;
  if ((object != (QObject *)0x0) && ((*(byte *)(*(long *)(object + 8) + 0x30) & 1) != 0)) {
    this_04 = globalStyleSheetStyle;
    if (globalStyleSheetStyle == (QStyleSheetStyle *)0x0) {
      QWidget::style((QWidget *)object);
      this_04 = (QStyleSheetStyle *)
                QMetaObject::cast((QObject *)&QStyleSheetStyle::staticMetaObject);
      if (this_04 == (QStyleSheetStyle *)0x0) goto LAB_0035446f;
    }
    iVar21 = QStyleSheetStyle::nativeFrameWidth((QStyleSheetStyle *)this_04,(QWidget *)object);
    fixupBorder(this,iVar21);
  }
LAB_0035446f:
  if ((((this_02->d).ptr)->bi).d.ptr != (QStyleSheetBorderImageData *)0x0) {
    QBrush::QBrush((QBrush *)local_e8.data);
    uVar3 = *(undefined8 *)this_05;
    *(ulong *)this_05 = CONCAT44(local_e8._4_4_,local_e8._0_4_);
    local_e8._0_4_ = (undefined4)uVar3;
    local_e8._4_4_ = (undefined4)((ulong)uVar3 >> 0x20);
    QBrush::~QBrush((QBrush *)local_e8.data);
  }
LAB_003544a3:
  QIcon::~QIcon((QIcon *)&local_270);
  QIcon::~QIcon(&local_260);
  QBrush::~QBrush((QBrush *)&local_258);
  QBrush::~QBrush((QBrush *)&local_250);
  QBrush::~QBrush((QBrush *)&local_248);
  QBrush::~QBrush((QBrush *)&local_240);
  QBrush::~QBrush((QBrush *)&local_238);
  QBrush::~QBrush((QBrush *)&local_230);
  if ((QArrayData *)local_218._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_218._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_218._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_218._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_218._0_8_,2,0x10);
    }
  }
  QBrush::~QBrush((QBrush *)&local_200);
  lVar32 = 0x18;
  do {
    QBrush::~QBrush((QBrush *)((long)&local_88 + lVar32));
    lVar32 = lVar32 + -8;
  } while (lVar32 != -8);
  QPalette::~QPalette((QPalette *)local_148);
  QFont::~QFont((QFont *)&puStack_160);
  QArrayDataPointer<QCss::Declaration>::~QArrayDataPointer(&local_178);
  QPalette::~QPalette((QPalette *)local_138);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QRenderRule::QRenderRule(const QList<Declaration> &declarations, const QObject *object)
    : features(0),
      hasFont(false),
      pal(nullptr),
      b(nullptr),
      bg(nullptr),
      bd(nullptr),
      ou(nullptr),
      geo(nullptr),
      p(nullptr),
      img(nullptr),
      clipset(0)
{
    QPalette palette = QGuiApplication::palette(); // ###: ideally widget's palette
    ValueExtractor v(declarations, palette);
    features = v.extractStyleFeatures();

    int w = -1, h = -1, minw = -1, minh = -1, maxw = -1, maxh = -1;
    if (v.extractGeometry(&w, &h, &minw, &minh, &maxw, &maxh))
        geo = new QStyleSheetGeometryData(w, h, minw, minh, maxw, maxh);

    int left = 0, top = 0, right = 0, bottom = 0;
    Origin origin = Origin_Unknown;
    Qt::Alignment position;
    QCss::PositionMode mode = PositionMode_Unknown;
    Qt::Alignment textAlignment;
    if (v.extractPosition(&left, &top, &right, &bottom, &origin, &position, &mode, &textAlignment))
        p = new QStyleSheetPositionData(left, top, right, bottom, origin, position, mode, textAlignment);

    int margins[4], paddings[4], spacing = -1;
    for (int i = 0; i < 4; i++)
        margins[i] = paddings[i] = 0;
    if (v.extractBox(margins, paddings, &spacing))
        b = new QStyleSheetBoxData(margins, paddings, spacing);

    int borders[4];
    QBrush colors[4];
    QCss::BorderStyle styles[4];
    QSize radii[4];
    for (int i = 0; i < 4; i++) {
        borders[i] = 0;
        styles[i] = BorderStyle_None;
    }
    if (v.extractBorder(borders, colors, styles, radii))
        bd = new QStyleSheetBorderData(borders, colors, styles, radii);

    int offsets[4];
    for (int i = 0; i < 4; i++) {
        borders[i] = offsets[i] = 0;
        styles[i] = BorderStyle_None;
    }
    if (v.extractOutline(borders, colors, styles, radii, offsets))
        ou = new QStyleSheetOutlineData(borders, colors, styles, radii, offsets);

    QBrush brush;
    QString uri;
    Repeat repeat = Repeat_XY;
    Qt::Alignment alignment = Qt::AlignTop | Qt::AlignLeft;
    Attachment attachment = Attachment_Scroll;
    origin = Origin_Padding;
    Origin clip = Origin_Border;
    if (v.extractBackground(&brush, &uri, &repeat, &alignment, &origin, &attachment, &clip)) {
        QPixmap pixmap = QStyleSheetStyle::loadPixmap(uri, object);
        if (!uri.isEmpty() && pixmap.isNull())
            qWarning("Could not create pixmap from %s", qPrintable(QDir::toNativeSeparators(uri)));
        bg = new QStyleSheetBackgroundData(brush, pixmap, repeat, alignment, origin, attachment, clip);
    }

    QBrush foreground;
    QBrush selectedForeground;
    QBrush selectedBackground;
    QBrush alternateBackground;
    QBrush placeHolderTextForeground;
    QBrush accent;
    if (v.extractPalette(&foreground, &selectedForeground, &selectedBackground,
                         &alternateBackground, &placeHolderTextForeground, &accent)) {
        pal = new QStyleSheetPaletteData(foreground, selectedForeground, selectedBackground,
                                         alternateBackground, placeHolderTextForeground, accent);
    }

    QIcon imgIcon;
    alignment = Qt::AlignCenter;
    QSize imgSize;
    if (v.extractImage(&imgIcon, &alignment, &imgSize))
        img = new QStyleSheetImageData(imgIcon, alignment, imgSize);

    QIcon icon;
    QSize size;
    if (v.extractIcon(&icon, &size))
        iconPtr = new QStyleSheetImageData(icon, Qt::AlignCenter, size);

    int adj = -255;
    hasFont = v.extractFont(&font, &adj);

#if QT_CONFIG(tooltip)
    if (object && qstrcmp(object->metaObject()->className(), "QTipLabel") == 0)
        palette = QToolTip::palette();
#endif

    for (int i = 0; i < declarations.size(); i++) {
        const Declaration& decl = declarations.at(i);
        if (decl.d->propertyId == BorderImage) {
            QString uri;
            QCss::TileMode horizStretch, vertStretch;
            int cuts[4];

            decl.borderImageValue(&uri, cuts, &horizStretch, &vertStretch);
            if (uri.isEmpty() || uri == "none"_L1) {
                if (bd && bd->bi)
                    bd->bi->pixmap = QPixmap();
            } else {
                if (!bd)
                    bd = new QStyleSheetBorderData;
                if (!bd->bi)
                    bd->bi = new QStyleSheetBorderImageData;

                QStyleSheetBorderImageData *bi = bd->bi;
                bi->pixmap = QStyleSheetStyle::loadPixmap(uri, object);
                for (int i = 0; i < 4; i++)
                    bi->cuts[i] = cuts[i];
                bi->horizStretch = horizStretch;
                bi->vertStretch = vertStretch;
            }
        } else if (decl.d->propertyId == QtBackgroundRole) {
            if (bg && bg->brush.style() != Qt::NoBrush)
                continue;
            int role = decl.d->values.at(0).variant.toInt();
            if (role >= Value_FirstColorRole && role <= Value_LastColorRole)
                defaultBackground = palette.color((QPalette::ColorRole)(role-Value_FirstColorRole));
        } else if (decl.d->property.startsWith("qproperty-"_L1, Qt::CaseInsensitive)) {
            // intentionally left blank...
        } else if (decl.d->propertyId == UnknownProperty) {
            bool knownStyleHint = false;
            for (const auto sh : knownStyleHints) {
                QLatin1StringView styleHint(sh);
                if (decl.d->property == styleHint) {
                    QVariant hintValue;
                    if (styleHint.endsWith("alignment"_L1)) {
                        hintValue = (int) decl.alignmentValue();
                    } else if (styleHint.endsWith("color"_L1)) {
                        hintValue = (int) decl.colorValue().rgba();
                    } else if (styleHint.endsWith("size"_L1)) {
                        // Check only for the 'em' case
                        const QString valueString = decl.d->values.at(0).variant.toString();
                        const bool isEmSize = valueString.endsWith(u"em", Qt::CaseInsensitive);
                        if (isEmSize || valueString.endsWith(u"ex", Qt::CaseInsensitive)) {
                            // 1em == size of font; 1ex == xHeight of font
                            // See lengthValueFromData helper in qcssparser.cpp
                            QFont fontForSize(font);
                            // if no font is specified, then use the widget font if possible
                            if (const QWidget *widget; !hasFont && (widget = qobject_cast<const QWidget*>(object)))
                                fontForSize = widget->font();

                            const QFontMetrics fontMetrics(fontForSize);
                            qreal pixelSize = isEmSize ? fontMetrics.height() : fontMetrics.xHeight();

                            // Transform size according to the 'em'/'ex' value
                            qreal emexSize = {};
                            if (decl.realValue(&emexSize, isEmSize ? "em" : "ex") && emexSize > 0) {
                                pixelSize *= emexSize;
                                const QSizeF newSize(pixelSize, pixelSize);
                                decl.d->parsed = QVariant::fromValue<QSizeF>(newSize);
                                hintValue = newSize;
                            } else {
                                qWarning("Invalid '%s' size for %s. Skipping.",
                                         isEmSize ? "em" : "ex", qPrintable(valueString));
                            }
                        } else {
                            // Normal case where we receive a 'px' or 'pt' unit
                            hintValue = decl.sizeValue();
                        }
                    } else if (styleHint.endsWith("icon"_L1)) {
                        hintValue = decl.iconValue();
                    } else if (styleHint == "button-layout"_L1 && decl.d->values.size() != 0
                               && decl.d->values.at(0).type == QCss::Value::String) {
                        hintValue = subControlLayout(decl.d->values.at(0).variant.toString().toLatin1());
                    } else {
                        int integer;
                        decl.intValue(&integer);
                        hintValue = integer;
                    }
                    styleHints[decl.d->property] = hintValue;
                    knownStyleHint = true;
                    break;
                }
            }
            if (!knownStyleHint)
                qWarning("Unknown property %s", qPrintable(decl.d->property));
        }
    }

    if (hasBorder()) {
        if (const QWidget *widget = qobject_cast<const QWidget *>(object)) {
            QStyleSheetStyle *style = const_cast<QStyleSheetStyle *>(globalStyleSheetStyle);
            if (!style)
                style = qt_styleSheet(widget->style());
            if (style)
                fixupBorder(style->nativeFrameWidth(widget));
        }
        if (border()->hasBorderImage())
            defaultBackground = QBrush();
    }
}